

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall Imf_2_5::DwaCompressor::Classifier::Classifier(Classifier *this,char **ptr,int size)

{
  InputExc *pIVar1;
  CompressorScheme CVar2;
  int n;
  char *pcVar3;
  allocator<char> local_149;
  string local_148 [32];
  char value;
  
  (this->_suffix)._M_dataplus._M_p = (pointer)&(this->_suffix).field_2;
  (this->_suffix)._M_string_length = 0;
  (this->_suffix).field_2._M_local_buf[0] = '\0';
  if (0 < size) {
    memset(&value,0,0x101);
    n = 0xff;
    if ((uint)size < 0xff) {
      n = size;
    }
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>(ptr,n,&value);
    std::__cxx11::string::string<std::allocator<char>>(local_148,&value,&local_149);
    std::__cxx11::string::operator=((string *)this,local_148);
    std::__cxx11::string::~string(local_148);
    if ((this->_suffix)._M_string_length + 3 <= (ulong)(uint)size) {
      Xdr::read<Imf_2_5::CharPtrIO,char_const*>(ptr,&value);
      this->_cscIdx = (int)(char)((value >> 4) - 1);
      if ((byte)(value >> 4) < 4) {
        CVar2 = (byte)value >> 2 & NUM_COMPRESSOR_SCHEMES;
        this->_scheme = CVar2;
        if (CVar2 == NUM_COMPRESSOR_SCHEMES) {
          pcVar3 = "Error uncompressing DWA data (corrupt scheme rule).";
        }
        else {
          this->_caseInsensitive = (bool)(value & 1);
          Xdr::read<Imf_2_5::CharPtrIO,char_const*>(ptr,&value);
          if ((byte)value < NUM_PIXELTYPES) {
            this->_type = (uint)(byte)value;
            return;
          }
          pcVar3 = "Error uncompressing DWA data (corrupt rule).";
        }
      }
      else {
        pcVar3 = "Error uncompressing DWA data (corrupt cscIdx rule).";
      }
      pIVar1 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar1,pcVar3);
      __cxa_throw(pIVar1,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
  }
  pIVar1 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar1,"Error uncompressing DWA data (truncated rule).");
  __cxa_throw(pIVar1,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

Classifier (const char *&ptr, int size)
    {
        if (size <= 0) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");
            
        {
            // maximum length of string plus one byte for terminating NULL
            char suffix[Name::SIZE+1];
            memset (suffix, 0, Name::SIZE+1);
            Xdr::read<CharPtrIO> (ptr, std::min(size, Name::SIZE-1), suffix);
            _suffix = std::string(suffix);
        }

        if (static_cast<size_t>(size) < _suffix.length() + 1 + 2*Xdr::size<char>()) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");

        char value;
        Xdr::read<CharPtrIO> (ptr, value);

        _cscIdx = (int)(value >> 4) - 1;
        if (_cscIdx < -1 || _cscIdx >= 3) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt cscIdx rule).");

        _scheme = (CompressorScheme)((value >> 2) & 3);
        if (_scheme < 0 || _scheme >= NUM_COMPRESSOR_SCHEMES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt scheme rule).");

        _caseInsensitive = (value & 1 ? true : false);

        Xdr::read<CharPtrIO> (ptr, value);
        if (value < 0 || value >= NUM_PIXELTYPES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt rule).");
        _type = (PixelType)value;
    }